

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_context_get_device_info__null
                    (ma_context *pContext,ma_device_type deviceType,ma_device_id *pDeviceID,
                    ma_share_mode shareMode,ma_device_info *pDeviceInfo)

{
  ma_result mVar1;
  long lVar2;
  char *src;
  
  if (pContext != (ma_context *)0x0) {
    if ((pDeviceID == (ma_device_id *)0x0) || (pDeviceID->wasapi[0] == L'\0')) {
      src = "NULL Capture Device";
      if (deviceType == ma_device_type_playback) {
        src = "NULL Playback Device";
      }
      ma_strncpy_s(pDeviceInfo->name,0x100,src,0xffffffffffffffff);
      pDeviceInfo->formatCount = 5;
      lVar2 = 0;
      while (lVar2 != 5) {
        pDeviceInfo->formats[lVar2] = (ma_format)(lVar2 + 1);
        lVar2 = lVar2 + 1;
      }
      pDeviceInfo->minChannels = 1;
      pDeviceInfo->maxChannels = 0x20;
      pDeviceInfo->minSampleRate = 8000;
      pDeviceInfo->maxSampleRate = 0x5dc00;
      mVar1 = 0;
    }
    else {
      mVar1 = -0x68;
    }
    return mVar1;
  }
  __assert_fail("pContext != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x24d6,
                "ma_result ma_context_get_device_info__null(ma_context *, ma_device_type, const ma_device_id *, ma_share_mode, ma_device_info *)"
               );
}

Assistant:

static ma_result ma_context_get_device_info__null(ma_context* pContext, ma_device_type deviceType, const ma_device_id* pDeviceID, ma_share_mode shareMode, ma_device_info* pDeviceInfo)
{
    ma_uint32 iFormat;

    MA_ASSERT(pContext != NULL);

    if (pDeviceID != NULL && pDeviceID->nullbackend != 0) {
        return MA_NO_DEVICE;   /* Don't know the device. */
    }

    /* Name / Description */
    if (deviceType == ma_device_type_playback) {
        ma_strncpy_s(pDeviceInfo->name, sizeof(pDeviceInfo->name), "NULL Playback Device", (size_t)-1);
    } else {
        ma_strncpy_s(pDeviceInfo->name, sizeof(pDeviceInfo->name), "NULL Capture Device", (size_t)-1);
    }

    /* Support everything on the null backend. */
    pDeviceInfo->formatCount = ma_format_count - 1;    /* Minus one because we don't want to include ma_format_unknown. */
    for (iFormat = 0; iFormat < pDeviceInfo->formatCount; ++iFormat) {
        pDeviceInfo->formats[iFormat] = (ma_format)(iFormat + 1);  /* +1 to skip over ma_format_unknown. */
    }

    pDeviceInfo->minChannels   = 1;
    pDeviceInfo->maxChannels   = MA_MAX_CHANNELS;
    pDeviceInfo->minSampleRate = MA_SAMPLE_RATE_8000;
    pDeviceInfo->maxSampleRate = MA_SAMPLE_RATE_384000;

    (void)pContext;
    (void)shareMode;
    return MA_SUCCESS;
}